

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__write(uv_stream_t *stream)

{
  uint *puVar1;
  undefined1 *puVar2;
  uv_handle_t *handle;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int *piVar8;
  long *plVar9;
  int iVar10;
  ulong uVar11;
  iovec *__iovec;
  msghdr msg;
  anon_union_64_2_d657c519 scratch;
  
LAB_0042be5f:
  if ((stream->io_watcher).fd < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x32d,"void uv__write(uv_stream_t *)");
  }
  puVar2 = (undefined1 *)stream->write_queue[0];
  if (stream->write_queue == (void **)puVar2) {
    return;
  }
  if (*(uv_stream_t **)(puVar2 + -8) != stream) {
    __assert_fail("req->handle == stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x334,"void uv__write(uv_stream_t *)");
  }
  iVar10 = *(int *)(puVar2 + 0x20) - *(uint *)(puVar2 + 0x10);
  __iovec = (iovec *)((ulong)*(uint *)(puVar2 + 0x10) * 0x10 + *(long *)(puVar2 + 0x18));
  iVar5 = uv__getiovmax();
  if (iVar5 <= iVar10) {
    iVar10 = iVar5;
  }
  handle = *(uv_handle_t **)(puVar2 + -0x10);
  if (handle != (uv_handle_t *)0x0) {
    if ((handle->flags & 3) == 0) {
      uVar6 = uv__handle_fd(handle);
      scratch.alias.cmsg_len = 0;
      scratch._8_8_ = 0;
      scratch._16_8_ = 0;
      scratch._24_8_ = 0;
      scratch._32_8_ = 0;
      scratch._40_8_ = 0;
      scratch._48_8_ = 0;
      scratch._56_8_ = 0;
      if ((int)uVar6 < 0) {
        __assert_fail("fd_to_send >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x35b,"void uv__write(uv_stream_t *)");
      }
      msg.msg_name = (void *)0x0;
      msg.msg_namelen = 0;
      msg.msg_iovlen = (size_t)iVar10;
      msg.msg_flags = 0;
      msg.msg_control = &scratch;
      msg.msg_controllen = 0x18;
      scratch._8_8_ = 0x100000001;
      scratch.alias.cmsg_len = 0x14;
      scratch._20_4_ = 0;
      scratch._16_4_ = uVar6;
      msg.msg_iov = (iovec *)__iovec;
LAB_0042bf27:
      uVar7 = sendmsg((stream->io_watcher).fd,(msghdr *)&msg,0);
      if (uVar7 == 0xffffffffffffffff) goto code_r0x0042bf3d;
      if (-1 < (long)uVar7) {
        *(undefined8 *)(puVar2 + -0x10) = 0;
      }
LAB_0042bf9b:
      if (-1 < (long)uVar7) {
        if (stream->write_queue_size < uVar7) {
          __assert_fail("n <= stream->write_queue_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x2e7,"int uv__write_req_update(uv_stream_t *, uv_write_t *, size_t)");
        }
        stream->write_queue_size = stream->write_queue_size - uVar7;
        lVar3 = *(long *)(puVar2 + 0x18);
        plVar9 = (long *)((ulong)*(uint *)(puVar2 + 0x10) * 0x10 + lVar3);
        do {
          uVar4 = plVar9[1];
          uVar11 = uVar4;
          if (uVar7 < uVar4) {
            uVar11 = uVar7;
          }
          *plVar9 = *plVar9 + uVar11;
          plVar9[1] = uVar4 - uVar11;
          plVar9 = plVar9 + (ulong)(uVar4 <= uVar7) * 2;
          uVar7 = uVar7 - uVar11;
        } while (uVar7 != 0);
        iVar10 = (int)((ulong)((long)plVar9 - lVar3) >> 4);
        *(int *)(puVar2 + 0x10) = iVar10;
        if (*(int *)(puVar2 + 0x20) == iVar10) {
          uv__write_req_finish((uv_write_t *)(puVar2 + -0x58));
          return;
        }
      }
      goto LAB_0042c002;
    }
    iVar5 = -9;
    goto LAB_0042c039;
  }
  do {
    iVar5 = (stream->io_watcher).fd;
    if (iVar10 == 1) {
      uVar7 = write(iVar5,__iovec->iov_base,__iovec->iov_len);
    }
    else {
      uVar7 = writev(iVar5,__iovec,iVar10);
    }
    if (uVar7 != 0xffffffffffffffff) goto LAB_0042bf9b;
    piVar8 = __errno_location();
    iVar5 = *piVar8;
  } while (iVar5 == 4);
  goto LAB_0042bf82;
code_r0x0042bf3d:
  piVar8 = __errno_location();
  if (*piVar8 != 4) goto code_r0x0042bf47;
  goto LAB_0042bf27;
code_r0x0042bf47:
  iVar5 = *piVar8;
LAB_0042bf82:
  if ((iVar5 != 0xb) && (iVar5 != 0x69)) {
    iVar5 = -iVar5;
LAB_0042c039:
    *(int *)(puVar2 + 0x24) = iVar5;
    uv__write_req_finish((uv_write_t *)(puVar2 + -0x58));
    uv__io_stop(stream->loop,&stream->io_watcher,4);
    iVar10 = uv__io_active(&stream->io_watcher,1);
    if (iVar10 != 0) {
      return;
    }
    uVar6 = stream->flags;
    if ((uVar6 & 4) == 0) {
      return;
    }
    stream->flags = uVar6 & 0xfffffffb;
    if ((uVar6 & 8) == 0) {
      return;
    }
    puVar1 = &stream->loop->active_handles;
    *puVar1 = *puVar1 - 1;
    return;
  }
LAB_0042c002:
  if ((stream->flags & 0x100000) == 0) {
    uv__io_start(stream->loop,&stream->io_watcher,4);
    return;
  }
  goto LAB_0042be5f;
}

Assistant:

static void uv__write(uv_stream_t* stream) {
  struct iovec* iov;
  QUEUE* q;
  uv_write_t* req;
  int iovmax;
  int iovcnt;
  ssize_t n;
  int err;

start:

  assert(uv__stream_fd(stream) >= 0);

  if (QUEUE_EMPTY(&stream->write_queue))
    return;

  q = QUEUE_HEAD(&stream->write_queue);
  req = QUEUE_DATA(q, uv_write_t, queue);
  assert(req->handle == stream);

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  assert(sizeof(uv_buf_t) == sizeof(struct iovec));
  iov = (struct iovec*) &(req->bufs[req->write_index]);
  iovcnt = req->nbufs - req->write_index;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */

  if (req->send_handle) {
    int fd_to_send;
    struct msghdr msg;
    struct cmsghdr *cmsg;
    union {
      char data[64];
      struct cmsghdr alias;
    } scratch;

    if (uv__is_closing(req->send_handle)) {
      err = UV_EBADF;
      goto error;
    }

    fd_to_send = uv__handle_fd((uv_handle_t*) req->send_handle);

    memset(&scratch, 0, sizeof(scratch));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &scratch.alias;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg = CMSG_FIRSTHDR(&msg);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = CMSG_LEN(sizeof(fd_to_send));

    /* silence aliasing warning */
    {
      void* pv = CMSG_DATA(cmsg);
      int* pi = pv;
      *pi = fd_to_send;
    }

    do
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));

    /* Ensure the handle isn't sent again in case this is a partial write. */
    if (n >= 0)
      req->send_handle = NULL;
  } else {
    do
      n = uv__writev(uv__stream_fd(stream), iov, iovcnt);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));
  }

  if (n == -1 && !IS_TRANSIENT_WRITE_ERROR(errno, req->send_handle)) {
    err = UV__ERR(errno);
    goto error;
  }

  if (n >= 0 && uv__write_req_update(stream, req, n)) {
    uv__write_req_finish(req);
    return;  /* TODO(bnoordhuis) Start trying to write the next request. */
  }

  /* If this is a blocking stream, try again. */
  if (stream->flags & UV_HANDLE_BLOCKING_WRITES)
    goto start;

  /* We're not done. */
  uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);

  /* Notify select() thread about state change */
  uv__stream_osx_interrupt_select(stream);

  return;

error:
  req->error = err;
  uv__write_req_finish(req);
  uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
  if (!uv__io_active(&stream->io_watcher, POLLIN))
    uv__handle_stop(stream);
  uv__stream_osx_interrupt_select(stream);
}